

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockHouseholder.h
# Opt level: O1

void Eigen::internal::
     apply_block_householder_on_the_left<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>const,_1>>
               (Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *mat,
               Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *vectors,
               VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *hCoeffs,bool forward)

{
  ulong rows;
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 *puVar5;
  char *__function;
  Matrix<float,__1,__1,_1,__1,__1> T;
  Matrix<float,__1,__1,_0,__1,__1> tmp;
  type tmp_1;
  assign_op<float,_float> local_119;
  Matrix<float,__1,__1,_1,__1,__1> local_118;
  Matrix<float,__1,__1,_0,__1,__1> local_f8;
  PointerType local_e0;
  Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> local_d8;
  PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *local_a0;
  long lStack_98;
  long local_90;
  XprTypeNested pMStack_88;
  long local_80;
  long lStack_78;
  Index local_70;
  SrcXprType local_68;
  XprTypeNested local_58;
  long lStack_50;
  long local_48;
  Index IStack_40;
  
  rows = (vectors->
         super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
         super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
         m_cols.m_value;
  local_118.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (float *)0x0;
  local_118.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  local_118.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  if ((long)rows < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1, 1, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1, 1, -1, -1>]"
                 );
  }
  if ((rows != 0) &&
     (auVar3._8_8_ = 0, auVar3._0_8_ = rows,
     auVar4 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar4 / auVar3,0) < (long)rows)) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8,vectors,SUB168(auVar4 % auVar3,0));
    *puVar5 = boost::program_options::detail::cmdline::cmdline;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  DenseStorage<float,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<float,__1,__1,__1,_1> *)&local_118,rows * rows,rows,rows);
  if (forward) {
    make_block_householder_triangular_factor<Eigen::Matrix<float,_1,_1,1,_1,_1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>const,_1>>
              (&local_118,vectors,hCoeffs);
  }
  else {
    make_block_householder_triangular_factor<Eigen::Matrix<float,_1,_1,1,_1,_1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>const,_1,1,false>>
              (&local_118,vectors,
               &hCoeffs->super_Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>);
  }
  local_e0 = (vectors->
             super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
             m_data;
  lVar1 = (vectors->
          super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
          m_rows.m_value;
  lVar2 = (vectors->
          super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
          m_cols.m_value;
  local_48 = (vectors->
             super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             m_startCol.m_value;
  IStack_40 = (vectors->
              super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>)
              .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_outerStride;
  local_58 = (vectors->
             super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             m_xpr;
  lStack_50 = (vectors->
              super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>)
              .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_startRow.m_value;
  local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (vectors->
       super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
       super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr;
  local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startRow.
  m_value = (vectors->
            super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            m_startRow.m_value;
  local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startCol.
  m_value = (vectors->
            super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            m_startCol.m_value;
  local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_outerStride
       = (vectors->
         super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
         super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
         m_outerStride;
  local_70 = (mat->
             super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             m_outerStride;
  local_a0 = (PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)
             (mat->
             super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
             m_data;
  lStack_98 = (mat->
              super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>)
              .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_rows.m_value;
  local_90 = (mat->
             super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
             m_cols.m_value;
  pMStack_88 = (mat->
               super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               ).super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
               .m_xpr;
  local_80 = (mat->
             super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             m_startRow.m_value;
  lStack_78 = (mat->
              super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>)
              .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_startCol.m_value;
  local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       local_e0;
  local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = lVar1;
  local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = lVar2;
  if (lVar1 == (mat->
               super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               ).super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
               .m_rows.m_value) {
    PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::TriangularView<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>const>const,6u>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_f8,
               (DenseBase<Eigen::Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>_>
                *)&local_d8);
    if (forward) {
      if (local_118.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.m_storage.m_cols
          != local_f8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows) {
        __function = 
        "Eigen::Product<Eigen::TriangularView<Eigen::Matrix<float, -1, -1, 1, -1, -1>, 2>, Eigen::Matrix<float, -1, -1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::TriangularView<Eigen::Matrix<float, -1, -1, 1, -1, -1>, 2>, _Rhs = Eigen::Matrix<float, -1, -1>, Option = 0]"
        ;
        goto LAB_001846aa;
      }
      local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (PointerType)0x0;
      local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
      m_value = 0;
      local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
      m_value = 0;
      local_68.m_lhs.m_matrix.m_matrix = (MatrixTypeNested)(MatrixTypeNested)&local_118;
      local_68.m_rhs = (RhsNested)&local_f8;
      Assignment<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::TriangularView<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_2U>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<float,__1,__1,_0,__1,__1> *)&local_d8,(SrcXprType *)&local_68,&local_119);
      call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::internal::assign_op<float,float>>
                (&local_f8,(Matrix<float,__1,__1,_0,__1,__1> *)&local_d8,&local_119);
    }
    else {
      if (local_118.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.m_storage.m_rows
          != local_f8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows) {
        __function = 
        "Eigen::Product<Eigen::TriangularView<const Eigen::Transpose<const Eigen::Matrix<float, -1, -1, 1, -1, -1>>, 1>, Eigen::Matrix<float, -1, -1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::TriangularView<const Eigen::Transpose<const Eigen::Matrix<float, -1, -1, 1, -1, -1>>, 1>, _Rhs = Eigen::Matrix<float, -1, -1>, Option = 0]"
        ;
        goto LAB_001846aa;
      }
      local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (PointerType)0x0;
      local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
      m_value = 0;
      local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
      m_value = 0;
      local_68.m_lhs.m_matrix.m_matrix = (MatrixTypeNested)(MatrixTypeNested)&local_118;
      local_68.m_rhs = (RhsNested)&local_f8;
      Assignment<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>,_1U>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<float,__1,__1,_0,__1,__1> *)&local_d8,&local_68,&local_119);
      call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::internal::assign_op<float,float>>
                (&local_f8,(Matrix<float,__1,__1,_0,__1,__1> *)&local_d8,&local_119);
    }
    free(local_d8.
         super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
         m_data);
    local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
         local_e0;
    local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
         local_58;
    local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startRow.
    m_value = lStack_50;
    local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startCol.
    m_value = local_48;
    local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    m_outerStride = IStack_40;
    local_a0 = (PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_f8;
    if (lVar2 == local_f8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows) {
      if (((mat->
           super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_rows.m_value == lVar1) &&
         ((mat->
          super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
          m_cols.m_value ==
          local_f8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
         ) {
        local_68.m_lhs.m_matrix.m_matrix._0_4_ = 0xbf800000;
        local_d8.
        super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_rows.m_value = lVar1;
        local_d8.
        super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_cols.m_value = lVar2;
        triangular_product_impl<5,true,Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,-1,false>const,false,Eigen::Matrix<float,-1,-1,0,-1,-1>,false>
        ::run<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>>
                  (mat,&local_d8,&local_f8,(Scalar *)&local_68);
        free(local_f8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(local_118.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.m_storage.
             m_data);
        return;
      }
      local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
      m_value = lVar1;
      local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
      m_value = lVar2;
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/ProductEvaluators.h"
                    ,0xb0,
                    "static void Eigen::internal::Assignment<Eigen::Block<Eigen::Matrix<float, -1, -1>>, Eigen::Product<Eigen::TriangularView<const Eigen::Block<Eigen::Matrix<float, -1, -1>>, 5>, Eigen::Matrix<float, -1, -1>>, Eigen::internal::sub_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::sub_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Block<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Product<Eigen::TriangularView<const Eigen::Block<Eigen::Matrix<float, -1, -1>>, 5>, Eigen::Matrix<float, -1, -1>>, Functor = Eigen::internal::sub_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
                   );
    }
    __function = 
    "Eigen::Product<Eigen::TriangularView<const Eigen::Block<Eigen::Matrix<float, -1, -1>>, 5>, Eigen::Matrix<float, -1, -1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::TriangularView<const Eigen::Block<Eigen::Matrix<float, -1, -1>>, 5>, _Rhs = Eigen::Matrix<float, -1, -1>, Option = 0]"
    ;
    local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
    m_value = lVar1;
    local_d8.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
    m_value = lVar2;
  }
  else {
    __function = 
    "Eigen::Product<Eigen::TriangularView<const Eigen::Transpose<const Eigen::Block<Eigen::Matrix<float, -1, -1>>>, 6>, Eigen::Block<Eigen::Matrix<float, -1, -1>>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::TriangularView<const Eigen::Transpose<const Eigen::Block<Eigen::Matrix<float, -1, -1>>>, 6>, _Rhs = Eigen::Block<Eigen::Matrix<float, -1, -1>>, Option = 0]"
    ;
  }
LAB_001846aa:
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Product.h"
                ,0x62,__function);
}

Assistant:

void apply_block_householder_on_the_left(MatrixType& mat, const VectorsType& vectors, const CoeffsType& hCoeffs, bool forward)
{
  enum { TFactorSize = MatrixType::ColsAtCompileTime };
  Index nbVecs = vectors.cols();
  Matrix<typename MatrixType::Scalar, TFactorSize, TFactorSize, RowMajor> T(nbVecs,nbVecs);
  
  if(forward) make_block_householder_triangular_factor(T, vectors, hCoeffs);
  else        make_block_householder_triangular_factor(T, vectors, hCoeffs.conjugate());  
  const TriangularView<const VectorsType, UnitLower> V(vectors);

  // A -= V T V^* A
  Matrix<typename MatrixType::Scalar,VectorsType::ColsAtCompileTime,MatrixType::ColsAtCompileTime,
         (VectorsType::MaxColsAtCompileTime==1 && MatrixType::MaxColsAtCompileTime!=1)?RowMajor:ColMajor,
         VectorsType::MaxColsAtCompileTime,MatrixType::MaxColsAtCompileTime> tmp = V.adjoint() * mat;
  // FIXME add .noalias() once the triangular product can work inplace
  if(forward) tmp = T.template triangularView<Upper>()           * tmp;
  else        tmp = T.template triangularView<Upper>().adjoint() * tmp;
  mat.noalias() -= V * tmp;
}